

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cc
# Opt level: O0

void __thiscall
lexical::analyse(lexical *this,
                vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>
                *lines)

{
  bool bVar1;
  int iVar2;
  __shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar3;
  difference_type dVar4;
  reference pcVar5;
  allocator local_c1;
  string local_c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_> *local_98;
  iterator local_90;
  iterator local_88;
  iterator local_80;
  int local_78;
  int local_74;
  int column;
  int lineNumber;
  iterator it;
  iterator end;
  iterator begin;
  shared_ptr<StringLine> *line;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_> *__range1;
  Meta meta;
  vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_> *lines_local;
  lexical *this_local;
  
  meta.end._M_current = (char *)lines;
  Meta::Meta((Meta *)&__range1);
  __end1 = std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>::
           begin(lines);
  line = (shared_ptr<StringLine> *)
         std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>::
         end(lines);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<StringLine>_*,_std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>_>
                                *)&line);
    if (!bVar1) {
      return;
    }
    this_00 = (__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<StringLine>_*,_std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>_>
              ::operator*(&__end1);
    peVar3 = std::__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    StringLine::get_text_abi_cxx11_(peVar3);
    end._M_current = (char *)std::__cxx11::string::begin();
    peVar3 = std::__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    StringLine::get_text_abi_cxx11_(peVar3);
    it._M_current = (char *)std::__cxx11::string::end();
    _column = end._M_current;
    peVar3 = std::__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    local_74 = StringLine::get_line(peVar3);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&column,&it), bVar1) {
      dVar4 = __gnu_cxx::operator-
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&column,&end);
      local_78 = (int)dVar4 + 1;
      Meta::Meta((Meta *)&local_98,local_74,local_78,(iterator *)&column,&end,&it);
      __range1 = local_98;
      meta._0_8_ = local_90._M_current;
      meta.cur_begin._M_current = local_88._M_current;
      meta.begin._M_current = local_80._M_current;
      pcVar5 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&column);
      bVar1 = sutil::is_blank(pcVar5);
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&column);
      }
      else {
        pcVar5 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&column);
        bVar1 = sutil::is_key(pcVar5,true);
        if (bVar1) {
          analyse_identifier(this,(iterator *)&column,(Meta *)&__range1);
        }
        else {
          pcVar5 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&column);
          iVar2 = isdigit((int)*pcVar5);
          bVar1 = true;
          if (iVar2 == 0) {
            pcVar5 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&column);
            if (*pcVar5 == '0') {
              pcVar5 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&column);
              iVar2 = tolower((int)*pcVar5);
              bVar1 = true;
              if (iVar2 == 0x78) goto LAB_0011fa5e;
            }
            pcVar5 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&column);
            bVar1 = false;
            if (*pcVar5 == '.') {
              local_a0 = __gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&column,1);
              pcVar5 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_a0);
              iVar2 = isdigit((int)*pcVar5);
              bVar1 = iVar2 != 0;
            }
          }
LAB_0011fa5e:
          if (bVar1) {
            analyse_number(this,(iterator *)&column,(Meta *)&__range1);
          }
          else {
            pcVar5 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&column);
            if (*pcVar5 == '@') {
              analyse_annotation(this,(iterator *)&column,(Meta *)&__range1);
            }
            else {
              pcVar5 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&column);
              bVar1 = Table::in_delimiter(&this->table,pcVar5);
              if (bVar1) {
                analyse_delimiter(this,(iterator *)&column,(Meta *)&__range1);
              }
              else {
                pcVar5 = __gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&column);
                bVar1 = Table::in_operator(&this->table,pcVar5);
                if (bVar1) {
                  analyse_operator(this,(iterator *)&column,(Meta *)&__range1);
                }
                else {
                  pcVar5 = __gnu_cxx::
                           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&column);
                  if (*pcVar5 == '\'') {
                    analyse_char(this,(iterator *)&column,(Meta *)&__range1);
                  }
                  else {
                    pcVar5 = __gnu_cxx::
                             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&column);
                    if (*pcVar5 == '\"') {
                      analyse_string(this,(iterator *)&column,(Meta *)&__range1);
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)&local_c0,anon_var_dwarf_20a09,&local_c1);
                      error(this,(iterator *)&column,(Meta *)&__range1,&local_c0);
                      std::__cxx11::string::~string((string *)&local_c0);
                      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<StringLine>_*,_std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void lexical::analyse(vector<shared_ptr<StringLine>> lines) {
    Meta meta;
    for (const auto &line : lines) {
        auto begin = line->get_text().begin();
        auto end = line->get_text().end();
        auto it = begin;
        int lineNumber = line->get_line();
        while (it != end) {
            int column = it - begin + 1;
            meta = Meta(lineNumber, column, it, begin, end);
            //空白字符不判断
            if (sutil::is_blank(*it)) {
                ++it;
                continue;
            }
            if (sutil::is_key(*it, true)) {
                if (analyse_identifier(it, meta)) continue;
            } else if (isdigit(*it) || (*it == '0' && tolower(*it) == 'x') || (*it == '.' && isdigit(*(it + 1)))) {
                if (analyse_number(it, meta))continue;
            } else if (*it == '@') {
                if (analyse_annotation(it, meta))continue;
            } else if (table.in_delimiter(*it)) {
                if (analyse_delimiter(it, meta))continue;
            } else if (table.in_operator(*it)) {
                if (analyse_operator(it, meta))continue;
            } else if (*it == '\'') {
                if (analyse_char(it, meta))continue;
            } else if (*it == '\"') {
                if (analyse_string(it, meta))continue;
            } else {
                error(it, meta, "非法的字符");
            }
        }
    }
}